

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O2

int IssueCommandRoboteq(ROBOTEQ *pRoboteq,char *commandType,char *command,char *args,int waitms,
                       char *response,BOOL bPlusMinus)

{
  FILE *pFVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  int respstrlen;
  char *resp;
  char tmp [256];
  char recvbuf [2048];
  char sendbuf [2048];
  
  resp = (char *)0x0;
  respstrlen = 0;
  memset(sendbuf,0,0x800);
  if (*args == '\0') {
    sprintf(sendbuf,"%.255s%.255s\r",commandType,command);
  }
  else {
    sprintf(sendbuf,"%.255s%.255s %.255s\r",commandType,command,args);
  }
  sVar3 = strlen(sendbuf);
  iVar2 = WriteAllRS232Port(&pRoboteq->RS232Port,(uint8 *)sendbuf,(int)sVar3);
  if (iVar2 != 0) {
    return 1;
  }
  if ((pRoboteq->bSaveRawData != 0) && ((FILE *)pRoboteq->pfSaveFile != (FILE *)0x0)) {
    fwrite(sendbuf,(long)(int)sVar3,1,(FILE *)pRoboteq->pfSaveFile);
    fflush((FILE *)pRoboteq->pfSaveFile);
  }
  mSleep((long)waitms);
  if (pRoboteq->bEcho != 0) {
    memset(recvbuf,0,0x800);
    iVar2 = ReadUntilRS232Port(&pRoboteq->RS232Port,(uint8 *)recvbuf,'\r',0x7ff);
    if (iVar2 != 0) {
      return 1;
    }
    if ((pRoboteq->bSaveRawData != 0) &&
       (pFVar1 = (FILE *)pRoboteq->pfSaveFile, pFVar1 != (FILE *)0x0)) {
      sVar3 = strlen(recvbuf);
      fwrite(recvbuf,sVar3,1,pFVar1);
      fflush((FILE *)pRoboteq->pfSaveFile);
    }
  }
  memset(recvbuf,0,0x800);
  iVar2 = ReadUntilRS232Port(&pRoboteq->RS232Port,(uint8 *)recvbuf,'\r',0x7ff);
  if (iVar2 != 0) {
    return 1;
  }
  if ((pRoboteq->bSaveRawData != 0) &&
     (pFVar1 = (FILE *)pRoboteq->pfSaveFile, pFVar1 != (FILE *)0x0)) {
    sVar3 = strlen(recvbuf);
    fwrite(recvbuf,sVar3,1,pFVar1);
    fflush((FILE *)pRoboteq->pfSaveFile);
  }
  if (bPlusMinus == 0) {
    sprintf(tmp,"%.254s=",command);
    pcVar4 = rstristrbeginend(recvbuf,tmp,"\r",&resp,&respstrlen);
    if (pcVar4 == (char *)0x0) goto LAB_0017a1f6;
    sprintf(response,"%.*s",(ulong)(uint)respstrlen,resp);
  }
  else {
    sVar3 = strlen(recvbuf);
    if (sVar3 < 2) {
LAB_0017a1f6:
      puts("Error reading data from a Roboteq. ");
      return 1;
    }
    *response = recvbuf[sVar3 - 2];
    response[1] = '\0';
  }
  return 0;
}

Assistant:

inline int IssueCommandRoboteq(ROBOTEQ* pRoboteq, char* commandType, char* command, char* args, int waitms, char* response, BOOL bPlusMinus)
{
	char sendbuf[MAX_NB_BYTES_ROBOTEQ];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_ROBOTEQ];
	int recvbuflen = 0;
	char tmp[256];
	char* resp = NULL;
	int respstrlen = 0;
	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	if (strlen(args) <= 0) sprintf(sendbuf, "%.255s%.255s\r", commandType, command);
	else sprintf(sendbuf, "%.255s%.255s %.255s\r", commandType, command, args);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteAllRS232Port(&pRoboteq->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	mSleep(waitms);
	
	if (pRoboteq->bEcho)
	{
		// Prepare the buffers.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

		if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
		{
			return EXIT_FAILURE;
		}
		if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
		{
			fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
			fflush(pRoboteq->pfSaveFile);
		}
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_ROBOTEQ-1; // Ensure it will be a null-terminated string.

	if (ReadUntilRS232Port(&pRoboteq->RS232Port, (unsigned char*)recvbuf, '\r', recvbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pRoboteq->bSaveRawData)&&(pRoboteq->pfSaveFile))
	{
		fwrite(recvbuf, strlen(recvbuf), 1, pRoboteq->pfSaveFile);
		fflush(pRoboteq->pfSaveFile);
	}

	// Check for "+\r" or "-\r".
	if (bPlusMinus)
	{
		if (strlen(recvbuf) < 2)
		{
			printf("Error reading data from a Roboteq. \n");
			return EXIT_FAILURE;
		}
		sprintf(response, "%c", recvbuf[strlen(recvbuf)-2]);
		return EXIT_SUCCESS;
	}
	
	sprintf(tmp, "%.254s=", command);
	if (!rstristrbeginend(recvbuf, tmp, "\r", &resp, &respstrlen))
	{
		printf("Error reading data from a Roboteq. \n");
		return EXIT_FAILURE;
	}
	sprintf(response, "%.*s", respstrlen, resp);

	return EXIT_SUCCESS;
}